

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::SstReader::SstReader(SstReader *this,IO *io,string *name,Mode mode,Comm *comm)

{
  char *__dest;
  SstStream p_Var1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  SstParamParser Parser;
  Comm local_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_50.field_2._M_allocated_capacity = 0x6564616552747353;
  local_50.field_2._8_2_ = 0x72;
  local_50._M_string_length = 9;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  helper::Comm::Comm(&local_118,comm);
  Engine::Engine(&this->super_Engine,&local_50,io,name,mode,&local_118);
  helper::Comm::~Comm(&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__SstReader_00888718;
  this->m_DefinitionsNotified = false;
  this->m_CurrentStepMetaData = (SstFullMetadata)0x0;
  this->m_BP5Deserializer = (BP5Deserializer *)0x0;
  (this->m_InfoMap)._M_h._M_buckets = &(this->m_InfoMap)._M_h._M_single_bucket;
  (this->m_InfoMap)._M_h._M_bucket_count = 1;
  (this->m_InfoMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_InfoMap)._M_h._M_element_count = 0;
  (this->m_InfoMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_InfoMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_InfoMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __dest = (char *)operator_new__(name->_M_string_length + 1);
  strcpy(__dest,(name->_M_dataplus)._M_p);
  SstParamParser::ParseParams
            ((SstParamParser *)&local_b0,(this->super_Engine).m_IO,&this->Params,
             (this->super_Engine).m_UserOptions);
  p_Var1 = SstReaderOpen(__dest,&this->Params,&(this->super_Engine).m_Comm);
  this->m_Input = p_Var1;
  if (p_Var1 == (SstStream)0x0) {
    operator_delete__(__dest);
    local_b0.field_2._M_allocated_capacity._0_4_ = 0x69676e45;
    local_b0.field_2._M_allocated_capacity._4_2_ = 0x656e;
    local_b0._M_string_length = 6;
    local_b0.field_2._M_local_buf[6] = '\0';
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0.field_2._M_allocated_capacity = 0x6564616552747353;
    local_d0.field_2._8_2_ = 0x72;
    local_d0._M_string_length = 9;
    local_70.field_2._M_allocated_capacity = 0x6564616552747353;
    local_70.field_2._8_2_ = 0x72;
    local_70._M_string_length = 9;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::operator+(&local_90,"SstReader did not find active Writer contact info in file \"",
                   &(this->super_Engine).m_Name);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_100 = *plVar3;
      lStack_f8 = plVar2[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar3;
      local_110 = (long *)*plVar2;
    }
    local_108 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_f0.field_2._M_allocated_capacity = *psVar4;
      local_f0.field_2._8_8_ = plVar2[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar4;
      local_f0._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_f0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    helper::Throw<std::runtime_error>(&local_b0,&local_d0,&local_70,&local_f0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  SstReaderGetParams(this->m_Input,&this->m_WriterMarshalMethod,&this->m_WriterIsRowMajor);
  SstReaderInitFFSCallback
            (this->m_Input,this,SstReader::anon_class_1_0_00000001::__invoke,
             SstReader::anon_class_1_0_00000001::__invoke,
             SstReader::anon_class_1_0_00000001::__invoke,
             SstReader::anon_class_1_0_00000001::__invoke,
             SstReader::anon_class_1_0_00000001::__invoke);
  operator_delete__(__dest);
  (this->super_Engine).m_IsOpen = true;
  return;
}

Assistant:

SstReader::SstReader(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("SstReader", io, name, mode, std::move(comm))
{
    char *cstr = new char[name.length() + 1];
    std::strcpy(cstr, name.c_str());

    Init();

    m_Input = SstReaderOpen(cstr, &Params, &m_Comm);
    if (!m_Input)
    {
        delete[] cstr;
        helper::Throw<std::runtime_error>("Engine", "SstReader", "SstReader",
                                          "SstReader did not find active "
                                          "Writer contact info in file \"" +
                                              m_Name + SST_POSTFIX +
                                              "\".  Timeout or non-current SST contact file?");
    }

    // Maybe need other writer-side params in the future, but for now only
    // marshal method, and if the writer is row major.
    SstReaderGetParams(m_Input, &m_WriterMarshalMethod, &m_WriterIsRowMajor);

    auto varFFSCallback = [](void *reader, const char *variableName, const int type, void *data) {
        adios2::DataType Type = (adios2::DataType)type;
        class SstReader::SstReader *Reader = reinterpret_cast<class SstReader::SstReader *>(reader);
        if (Type == adios2::DataType::Struct)
        {
            return (void *)NULL;
        }

#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *variable = &(Reader->m_IO.DefineVariable<T>(variableName));                   \
        variable->SetData((T *)data);                                                              \
        variable->m_AvailableStepsCount = 1;                                                       \
        Reader->RegisterCreatedVariable(variable);                                                 \
        return (void *)variable;                                                                   \
    }

        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type

        return (void *)NULL;
    };

    auto attrFFSCallback = [](void *reader, const char *attrName, const int type, void *data) {
        class SstReader::SstReader *Reader = reinterpret_cast<class SstReader::SstReader *>(reader);
        adios2::DataType Type = (adios2::DataType)type;
        if (attrName == NULL)
        {
            // if attrName is NULL, prepare for attr reinstallation
            Reader->m_IO.RemoveAllAttributes();
            return;
        }
        try
        {
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
            else if (Type == helper::GetDataType<std::string>())
            {
                Reader->m_IO.DefineAttribute<std::string>(attrName, *(char **)data, "", "/", true);
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Reader->m_IO.DefineAttribute<T>(attrName, *(T *)data, "", "/", true);                      \
    }

            ADIOS2_FOREACH_ATTRIBUTE_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
        }
        catch (...)
        {
            //            std::cout << "Load failed" << std::endl;
            return;
        }
        return;
    };

    auto arrayFFSCallback = [](void *reader, const char *variableName, const int type, int DimCount,
                               size_t *Shape, size_t *Start, size_t *Count) {
        std::vector<size_t> VecShape;
        std::vector<size_t> VecStart;
        std::vector<size_t> VecCount;
        adios2::DataType Type = (adios2::DataType)type;
        class SstReader::SstReader *Reader = reinterpret_cast<class SstReader::SstReader *>(reader);
        /*
         * setup shape of array variable as global (I.E. Count == Shape,
         * Start == 0)
         */
        if (Shape)
        {
            for (int i = 0; i < DimCount; i++)
            {
                VecShape.push_back(Shape[i]);
                VecStart.push_back(0);
                VecCount.push_back(Shape[i]);
            }
        }
        else
        {
            VecShape = {};
            VecStart = {};
            for (int i = 0; i < DimCount; i++)
            {
                VecCount.push_back(Count[i]);
            }
        }

        if (Type == adios2::DataType::Struct)
        {
            return (void *)NULL;
        }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *variable =                                                                    \
            &(Reader->m_IO.DefineVariable<T>(variableName, VecShape, VecStart, VecCount));         \
        variable->m_AvailableStepsCount = 1;                                                       \
        Reader->RegisterCreatedVariable(variable);                                                 \
        return (void *)variable;                                                                   \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        return (void *)NULL;
    };

    auto arrayBlocksInfoCallback = [](void *reader, void *variable, const int type, int WriterRank,
                                      int DimCount, size_t *Shape, size_t *Start, size_t *Count) {
        std::vector<size_t> VecShape;
        std::vector<size_t> VecStart;
        std::vector<size_t> VecCount;
        adios2::DataType Type = (adios2::DataType)type;
        class SstReader::SstReader *Reader = reinterpret_cast<class SstReader::SstReader *>(reader);
        size_t currentStep = SstCurrentStep(Reader->m_Input);

        /*
         * setup shape of array variable as global (I.E. Count == Shape,
         * Start == 0)
         */
        if (Shape)
        {
            for (int i = 0; i < DimCount; i++)
            {
                VecShape.push_back(Shape[i]);
                VecStart.push_back(Start[i]);
                VecCount.push_back(Count[i]);
            }
        }
        else
        {
            VecShape = {};
            VecStart = {};
            for (int i = 0; i < DimCount; i++)
            {
                VecCount.push_back(Count[i]);
            }
        }

        if (Type == adios2::DataType::Struct)
        {
            return;
        }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *Var = reinterpret_cast<class Variable<T> *>(variable);                        \
        auto savedShape = Var->m_Shape;                                                            \
        auto savedCount = Var->m_Count;                                                            \
        auto savedStart = Var->m_Start;                                                            \
        Var->m_Shape = VecShape;                                                                   \
        Var->m_Count = VecCount;                                                                   \
        Var->m_Start = VecStart;                                                                   \
        Var->SetBlockInfo((T *)NULL, currentStep);                                                 \
        Var->m_Shape = savedShape;                                                                 \
        Var->m_Count = savedCount;                                                                 \
        Var->m_Start = savedStart;                                                                 \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        return;
    };

    auto MinArraySetupUpcall = [](void *reader, int DimCount, size_t *Shape) {
        MinVarInfo *MV = new MinVarInfo(DimCount, Shape);
        return (void *)MV;
    };
    auto arrayMinBlocksInfoCallback = [](void *reader, void *MV, const int type, int WriterRank,
                                         int DimCount, size_t *Shape, size_t *Start,
                                         size_t *Count) {
        MinBlockInfo MBI;
        MinVarInfo *MinVar = (MinVarInfo *)MV;

        MBI.WriterID = WriterRank;
        MBI.BlockID = 0;
        MBI.Start = Start;
        MBI.Count = Count;

        MinVar->BlocksInfo.push_back(MBI);
        return;
    };

    static int UseMin = 1;
    if (UseMin == -1)
    {
        if (getenv("OldBlocksInfo") == NULL)
        {
            UseMin = 0;
        }
        else
        {
            UseMin = 1;
        }
    }
    if (UseMin)
        SstReaderInitFFSCallback(m_Input, this, varFFSCallback, arrayFFSCallback,
                                 MinArraySetupUpcall, attrFFSCallback, arrayMinBlocksInfoCallback);
    else
        SstReaderInitFFSCallback(m_Input, this, varFFSCallback, arrayFFSCallback, NULL,
                                 attrFFSCallback, arrayBlocksInfoCallback);

    delete[] cstr;
    m_IsOpen = true;
}